

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O3

int32_t helicsDataBufferFillFromRawString(HelicsDataBuffer data,char *str,int stringSize)

{
  byte *size;
  Message *pMVar1;
  char *in_RCX;
  SmallBuffer *ptr;
  string_view val;
  
  if ((data == (HelicsDataBuffer)0x0) || (*(int *)((long)data + 0x5c) != 0x24ea663f)) {
    pMVar1 = getMessageObj(data,(HelicsError *)0x0);
    if (pMVar1 == (Message *)0x0) {
      return 0;
    }
    data = &pMVar1->data;
  }
  size = (byte *)(long)stringSize + 8;
  helics::SmallBuffer::reserve((SmallBuffer *)data,(size_t)size);
  ((SmallBuffer *)data)->bufferSize = (size_t)size;
  val._M_str = in_RCX;
  val._M_len = (size_t)str;
  helics::detail::convertToBinary
            ((detail *)((SmallBuffer *)data)->heap,(byte *)(long)stringSize,val);
  return (int32_t)((SmallBuffer *)data)->bufferSize;
}

Assistant:

HELICS_EXPORT int32_t helicsDataBufferFillFromRawString(HelicsDataBuffer data, const char* str, int stringSize)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return 0;
    }
    try {
        helics::ValueConverter<std::string_view>::convert(std::string_view(str, stringSize), *ptr);
        return static_cast<int32_t>(ptr->size());
    }
    catch (const std::bad_alloc&) {
        return 0;
    }
}